

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::substring::
     merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator middle,iterator last,iterator buf
               ,value_type bufsize,value_type depth)

{
  iterator *piVar1;
  iterator first_00;
  iterator first_01;
  iterator middle_00;
  iterator middle_01;
  iterator last_00;
  iterator last_01;
  pos_type pVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_var_03;
  int extraout_var_04;
  undefined4 extraout_var_05;
  int extraout_var_06;
  int extraout_var_07;
  int extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  int extraout_var_12;
  int extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  int extraout_var_17;
  int extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  int extraout_var_22;
  int extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  int extraout_var_27;
  int extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  _Elt_pointer psVar6;
  uint uVar7;
  pos_type pVar8;
  BitmapArray<long> *pBVar9;
  long lVar10;
  pos_type pVar11;
  pos_type pVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  iterator last1;
  iterator first2;
  iterator p1;
  iterator p1_00;
  iterator p1_01;
  iterator p1_02;
  iterator p1_03;
  iterator p1_04;
  iterator p2;
  iterator p2_00;
  iterator p2_01;
  iterator p2_02;
  iterator p2_03;
  iterator p2_04;
  iterator first1;
  ulong local_f8;
  BitmapArray<long> *local_f0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_a0;
  pos_type local_68;
  pos_type local_60;
  ulong local_58;
  BitmapArray<long> *local_50;
  ulong uStack_48;
  BitmapArray<long> *local_40;
  ulong uStack_38;
  
  local_f0 = first.array_;
  pVar8 = PA.pos_;
  pBVar9 = PA.array_;
  uVar7 = 0;
  local_f8 = first.pos_;
LAB_001076ca:
  do {
    uVar14 = uVar7;
    while (uVar5 = last.pos_ - middle.pos_, bufsize < (long)uVar5) {
      uVar13 = middle.pos_ - local_f8;
      if ((long)uVar13 <= bufsize) {
        if (local_f8 < middle.pos_) {
          local_50 = local_f0;
          uStack_48 = local_f8;
          first_01.pos_ = local_f8;
          first_01.array_ = local_f0;
          middle_01.pos_ = middle.pos_;
          middle_01.array_ = middle.array_;
          last_01.pos_ = last.pos_;
          last_01.array_ = last.array_;
          merge_forward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (T,PA,buf,first_01,middle_01,last_01,depth);
        }
        goto LAB_00107acc;
      }
      local_68 = last.pos_;
      if ((long)uVar5 < (long)uVar13) {
        uVar13 = uVar5;
      }
      if ((long)uVar13 < 1) {
        lVar16 = 0;
      }
      else {
        local_60 = middle.pos_;
        lVar16 = 0;
        do {
          pVar11 = local_60;
          uVar5 = uVar13 >> 1;
          lVar10 = uVar5 + lVar16 + local_60;
          local_58 = uVar13;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar10);
          iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar10);
          lVar10 = ~(uVar5 + lVar16) + pVar11;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar10);
          iVar4 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar10);
          p1.pos_ = ((long)extraout_var >> 0x1f ^ CONCAT44(extraout_var_00,iVar3)) + pVar8;
          p1.array_ = pBVar9;
          p2.pos_ = ((long)extraout_var_01 >> 0x1f ^ CONCAT44(extraout_var_02,iVar4)) + pVar8;
          p2.array_ = pBVar9;
          iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
          if (iVar3 < 0) {
            lVar16 = lVar16 + uVar5 + 1;
            uVar5 = uVar5 - (~(uint)local_58 & 1);
          }
          uVar13 = uVar5;
        } while (0 < (long)uVar5);
      }
      if (lVar16 < 1) {
        if (((uVar14 & 1) != 0) &&
           ((*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8), -1 < extraout_var_17)) {
          (*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8 - 1);
          iVar3 = (*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8 - 1);
          iVar4 = (*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8);
          p1_02.pos_ = ((long)extraout_var_18 >> 0x1f ^ CONCAT44(extraout_var_19,iVar3)) + pVar8;
          p1_02.array_ = pBVar9;
          p2_02.pos_ = CONCAT44(extraout_var_20,iVar4) + pVar8;
          p2_02.array_ = pBVar9;
          iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_02,p2_02,depth);
          if (iVar3 == 0) {
            iVar3 = (*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8);
            (*(local_f0->super_Bitmap)._vptr_Bitmap[4])
                      (local_f0,local_f8,~CONCAT44(extraout_var_21,iVar3));
          }
        }
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
        if (-1 < extraout_var_22) {
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_ - 1);
          iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_ - 1);
          iVar4 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
          p1_03.pos_ = ((long)extraout_var_23 >> 0x1f ^ CONCAT44(extraout_var_24,iVar3)) + pVar8;
          p1_03.array_ = pBVar9;
          p2_03.pos_ = CONCAT44(extraout_var_25,iVar4) + pVar8;
          p2_03.array_ = pBVar9;
          iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_03,p2_03,depth);
          if (iVar3 == 0) {
            iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
            (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                      (middle.array_,middle.pos_,~CONCAT44(extraout_var_26,iVar3));
          }
        }
        if (((uVar14 & 2) != 0) &&
           ((*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_),
           -1 < extraout_var_27)) {
          (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_ - 1);
          iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_ - 1);
          iVar4 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_);
          p1_04.pos_ = ((long)extraout_var_28 >> 0x1f ^ CONCAT44(extraout_var_29,iVar3)) + pVar8;
          p1_04.array_ = pBVar9;
          p2_04.pos_ = CONCAT44(extraout_var_30,iVar4) + pVar8;
          p2_04.array_ = pBVar9;
          iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_04,p2_04,depth);
          if (iVar3 == 0) {
            iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_);
            (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                      (last.array_,last.pos_,~CONCAT44(extraout_var_31,iVar3));
          }
        }
        goto LAB_00107e84;
      }
      first1.pos_ = middle.pos_ - lVar16;
      last1.pos_ = middle.pos_;
      last1.array_ = middle.array_;
      first2.pos_ = middle.pos_;
      first2.array_ = middle.array_;
      first1.array_ = middle.array_;
      helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (first1,last1,first2);
      uVar5 = lVar16 + middle.pos_;
      uVar15 = 0;
      pVar11 = middle.pos_;
      pVar12 = middle.pos_;
      if (uVar5 < local_68) {
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar5);
        pVar2 = middle.pos_;
        if (extraout_var_03 < 0) {
          pVar11 = middle.pos_ + 1;
          do {
            (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,pVar11 - 2);
            pVar11 = pVar11 - 1;
          } while (extraout_var_04 < 0);
          iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar5);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,uVar5,~CONCAT44(extraout_var_05,iVar3));
        }
        do {
          pVar12 = pVar2;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,pVar12);
          pVar2 = pVar12 + 1;
        } while (extraout_var_06 < 0);
        uVar15 = 1;
      }
      if ((long)(local_68 - pVar12) < (long)(pVar11 - local_f8)) {
        uVar15 = uVar15 << (middle.pos_ == pVar11 && pVar12 == middle.pos_);
        local_a0.m_d = uVar15 & 0xfffffffe | uVar14 & 1;
        local_a0.m_a.array_ = local_f0;
        local_a0.m_a.pos_ = local_f8;
        local_a0.m_b.array_ = middle.array_;
        local_a0.m_c.array_ = middle.array_;
        psVar6 = (stack->c).
                 super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_a0.m_b.pos_ = first1.pos_;
        local_a0.m_c.pos_ = pVar11;
        if (psVar6 == (stack->c).
                      super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                      *)stack,&local_a0);
        }
        else {
          *(ulong *)&psVar6->m_d = CONCAT44(local_a0._52_4_,local_a0.m_d);
          (psVar6->m_c).array_ = middle.array_;
          (psVar6->m_c).pos_ = pVar11;
          (psVar6->m_b).array_ = middle.array_;
          (psVar6->m_b).pos_ = first1.pos_;
          (psVar6->m_a).array_ = local_f0;
          (psVar6->m_a).pos_ = local_f8;
          piVar1 = &(stack->c).
                    super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        uVar7 = uVar14 & 2 | uVar15 & 1;
        local_f0 = middle.array_;
        middle.pos_ = uVar5;
        local_f8 = pVar12;
        goto LAB_001076ca;
      }
      local_a0.m_c.array_ = last.array_;
      local_a0.m_c.pos_ = last.pos_;
      local_a0.m_d = uVar15 | uVar14 & 2;
      local_a0.m_a.array_ = middle.array_;
      local_a0.m_b.array_ = middle.array_;
      psVar6 = (stack->c).
               super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      middle.pos_ = first1.pos_;
      local_a0.m_a.pos_ = pVar12;
      local_a0.m_b.pos_ = uVar5;
      uVar14 = uVar7 & 1;
      if (psVar6 == (stack->c).
                    super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
        ::
        _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                  ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                    *)stack,&local_a0);
        last.array_ = middle.array_;
        last.pos_ = pVar11;
      }
      else {
        *(ulong *)&psVar6->m_d = CONCAT44(local_a0._52_4_,local_a0.m_d);
        (psVar6->m_c).array_ = last.array_;
        (psVar6->m_c).pos_ = last.pos_;
        (psVar6->m_b).array_ = middle.array_;
        (psVar6->m_b).pos_ = uVar5;
        (psVar6->m_a).array_ = middle.array_;
        (psVar6->m_a).pos_ = pVar12;
        piVar1 = &(stack->c).
                  super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
        last.array_ = middle.array_;
        last.pos_ = pVar11;
      }
    }
    if (middle.pos_ < last.pos_ && local_f8 < middle.pos_) {
      local_40 = local_f0;
      uStack_38 = local_f8;
      first_00.pos_ = local_f8;
      first_00.array_ = local_f0;
      middle_00.pos_ = middle.pos_;
      middle_00.array_ = middle.array_;
      last_00.pos_ = last.pos_;
      last_00.array_ = last.array_;
      merge_backward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (T,PA,buf,first_00,middle_00,last_00,depth);
    }
LAB_00107acc:
    if (((uVar14 & 1) != 0) &&
       ((*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8), -1 < extraout_var_07)) {
      (*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0);
      iVar3 = (*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8 - 1);
      iVar4 = (*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8);
      p1_00.pos_ = ((long)extraout_var_08 >> 0x1f ^ CONCAT44(extraout_var_09,iVar3)) + pVar8;
      p1_00.array_ = pBVar9;
      p2_00.pos_ = CONCAT44(extraout_var_10,iVar4) + pVar8;
      p2_00.array_ = pBVar9;
      iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_00,p2_00,depth);
      if (iVar3 == 0) {
        iVar3 = (*(local_f0->super_Bitmap)._vptr_Bitmap[5])(local_f0,local_f8);
        (*(local_f0->super_Bitmap)._vptr_Bitmap[4])
                  (local_f0,local_f8,~CONCAT44(extraout_var_11,iVar3));
      }
    }
    if (((uVar14 & 2) != 0) &&
       ((*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_),
       -1 < extraout_var_12)) {
      (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_ - 1);
      iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_ - 1);
      iVar4 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_);
      p1_01.pos_ = ((long)extraout_var_13 >> 0x1f ^ CONCAT44(extraout_var_14,iVar3)) + pVar8;
      p1_01.array_ = pBVar9;
      p2_01.pos_ = CONCAT44(extraout_var_15,iVar4) + pVar8;
      p2_01.array_ = pBVar9;
      iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_01,p2_01,depth);
      if (iVar3 == 0) {
        iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,last.pos_,~CONCAT44(extraout_var_16,iVar3));
      }
    }
LAB_00107e84:
    psVar6 = (stack->c).
             super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar6 == (stack->c).
                  super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      return;
    }
    if (psVar6 == (stack->c).
                  super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar6 = (stack->c).
               super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    local_f0 = psVar6[-1].m_a.array_;
    local_f8 = psVar6[-1].m_a.pos_;
    middle.array_ = psVar6[-1].m_b.array_;
    middle.pos_ = psVar6[-1].m_b.pos_;
    last.array_ = psVar6[-1].m_c.array_;
    last.pos_ = psVar6[-1].m_c.pos_;
    uVar7 = psVar6[-1].m_d;
    std::
    deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
    ::pop_back(&stack->c);
  } while( true );
}

Assistant:

void merge(stack_type &stack, const StringIterator_type T,
           const SAIterator_type PA, SAIterator_type first,
           SAIterator_type middle, SAIterator_type last, BufIterator_type buf,
           typename std::iterator_traits<SAIterator_type>::value_type bufsize,
           typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<SAIterator_type>::difference_type difference_type;
  typedef typename stack_type::value_type stackinfo_type;
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a)\
  {\
    if((0 <= *(a)) &&\
       (compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0)) {\
      *(a) = ~*(a);\
    }\
  }

  SAIterator_type i, j;
  difference_type m, len, half;
  int check, next;

  for (check = 0;;) {

    if ((last - middle) <= bufsize) {
      if ((first < middle) && (middle < last)) {
        merge_backward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    if ((middle - first) <= bufsize) {
      if (first < middle) {
        merge_forward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    for (m = 0, len = std::min(middle - first, last - middle), half = len >> 1;
        0 < len; len = half, half >>= 1) {
      if (compare(T, PA + GETIDX(*(middle + m + half)),
                  PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= ((len & 1) == 0);
      }
    }

    if (0 < m) {
      helper::vecswap(middle - m, middle, middle);
      i = j = middle, next = 0;
      if ((middle + m) < last) {
        if (*(middle + m) < 0) {
          for (; *(i - 1) < 0; --i) {
          }
          *(middle + m) = ~*(middle + m);
        }
        for (j = middle; *j < 0; ++j) {
        }
        next = 1;
      }
      if ((i - first) <= (last - j)) {
        STACK_PUSH4(j, middle + m, last, (check & 2) | (next & 1));
        middle -= m, last = i, check = (check & 1);
      } else {
        if ((i == middle) && (middle == j)) {
          next <<= 1;
        }
        STACK_PUSH4(first, middle - m, i, (check & 1) | (next & 2));
        first = j, middle += m, check = (check & 2) | (next & 1);
      }
    } else {
      if (check & 1) {
        MERGE_CHECK(first);
      }
      MERGE_CHECK(middle);
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
    }
  }
#undef GETIDX
#undef MERGE_CHECK
}